

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test::
TestBody(SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test *this)

{
  bool bVar1;
  WrapperMock *pWVar2;
  MockSpec<int_(unsigned_int)> *this_00;
  TypedExpectation<int_(unsigned_int)> *this_01;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_02;
  StrictMock<solitaire::SDL::WrapperMock> *__return_storage_ptr__;
  MockSpec<void_()> *this_03;
  char *message;
  AssertHelper local_130;
  Message local_128 [2];
  runtime_error *anon_var_0;
  type e;
  undefined1 auStack_e8 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  MockSpec<void_()> local_c0;
  PolymorphicAction local_a9;
  undefined1 local_a8 [32];
  ReturnAction<int> local_88;
  Action<int_(unsigned_int)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_int> local_48;
  MockSpec<int_(unsigned_int)> local_30;
  SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test *local_10;
  SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test *this_local;
  
  local_10 = this;
  pWVar2 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                      (&(this->super_SDLGraphicsSystemTests).sdlMock)->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher(&local_48,0x20);
  SDL::WrapperMock::gmock_init(&local_30,pWVar2,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(unsigned_int)>::operator()
                      (&local_30,local_55,(void *)0x0);
  this_01 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x85,"*sdlMock","init(0x00000020u)");
  testing::Return<int>((testing *)&local_88,0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce(this_01,&local_78);
  testing::Action<int_(unsigned_int)>::~Action(&local_78);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
  testing::internal::MockSpec<int_(unsigned_int)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_int>::~Matcher(&local_48);
  this_02 = SDLGraphicsSystemTests::expectSDLCreateWindow
                      (&this->super_SDLGraphicsSystemTests,
                       (string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  testing::ReturnNull();
  pWVar2 = (WrapperMock *)local_a8;
  testing::PolymorphicAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
              *)pWVar2,&local_a9);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_02,(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                      *)pWVar2);
  testing::
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::~Action((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
             *)local_a8);
  __return_storage_ptr__ =
       mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                 (&(this->super_SDLGraphicsSystemTests).sdlMock);
  local_c0.function_mocker_ =
       (FunctionMocker<void_()> *)
       SDL::WrapperMock::gmock_quit((MockSpec<void_()> *)__return_storage_ptr__,pWVar2);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::MockSpec<void_()>::operator()
                      (&local_c0,(WithoutMatchers *)(gtest_msg.value.field_2._M_local_buf + 0xf),
                       (void *)0x0);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (this_03,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x87,"*sdlMock","quit()");
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_e8[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffff19 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_e8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_e8);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      SDLGraphicsSystem::createWindow
                (&(this->super_SDLGraphicsSystemTests).system,
                 (string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
    }
    if ((e._7_1_ & 1) != 0) goto LAB_002d1ccc;
    std::__cxx11::string::operator=
              ((string *)auStack_e8,
               "Expected: system.createWindow(title, windowWidth, windowHeight) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_128);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x8c,message);
  testing::internal::AssertHelper::operator=(&local_130,local_128);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  testing::Message::~Message(local_128);
LAB_002d1ccc:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_e8);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemTests, throwIfSDLCreateWindowFailedDuringWindowCreation) {
    EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
    expectSDLCreateWindow(title, windowWidth, windowHeight).WillOnce(ReturnNull());
    EXPECT_CALL(*sdlMock, quit());

    EXPECT_THROW(
        system.createWindow(title, windowWidth, windowHeight),
        std::runtime_error
    );
}